

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVRFile.cpp
# Opt level: O2

void __thiscall BVRFile::BVRFile(BVRFile *this,vector<char,_std::allocator<char>_> *buf)

{
  byte bVar1;
  pointer __src;
  pointer pBVar2;
  size_t __size;
  BVRFile *pBVar3;
  pointer ppcVar4;
  int iVar5;
  char *__locale;
  char *pcVar6;
  size_t __n;
  ulong uVar7;
  pointer ppcVar8;
  allocator<char> local_25d;
  uint local_25c;
  char *local_258;
  char *p;
  BVRFile *local_230;
  char *arena;
  BRDPoint point;
  vector<char_*,_std::allocator<char_*>_> lines;
  BRDPin pin;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [2];
  char ppn [100];
  
  BRDFileBase::BRDFileBase(&this->super_BRDFileBase);
  (this->super_BRDFileBase)._vptr_BRDFileBase = (_func_int **)&PTR__BRDFileBase_00203378;
  uVar7 = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  ppn[0x50] = '\0';
  ppn[0x51] = '\0';
  ppn[0x52] = '\0';
  ppn[0x53] = '\0';
  ppn[0x54] = '\0';
  ppn[0x55] = '\0';
  ppn[0x56] = '\0';
  ppn[0x57] = '\0';
  ppn[0x58] = '\0';
  ppn[0x59] = '\0';
  ppn[0x5a] = '\0';
  ppn[0x5b] = '\0';
  ppn[0x5c] = '\0';
  ppn[0x5d] = '\0';
  ppn[0x5e] = '\0';
  ppn[0x5f] = '\0';
  ppn[0x40] = '\0';
  ppn[0x41] = '\0';
  ppn[0x42] = '\0';
  ppn[0x43] = '\0';
  ppn[0x44] = '\0';
  ppn[0x45] = '\0';
  ppn[0x46] = '\0';
  ppn[0x47] = '\0';
  ppn[0x48] = '\0';
  ppn[0x49] = '\0';
  ppn[0x4a] = '\0';
  ppn[0x4b] = '\0';
  ppn[0x4c] = '\0';
  ppn[0x4d] = '\0';
  ppn[0x4e] = '\0';
  ppn[0x4f] = '\0';
  ppn[0x30] = '\0';
  ppn[0x31] = '\0';
  ppn[0x32] = '\0';
  ppn[0x33] = '\0';
  ppn[0x34] = '\0';
  ppn[0x35] = '\0';
  ppn[0x36] = '\0';
  ppn[0x37] = '\0';
  ppn[0x38] = '\0';
  ppn[0x39] = '\0';
  ppn[0x3a] = '\0';
  ppn[0x3b] = '\0';
  ppn[0x3c] = '\0';
  ppn[0x3d] = '\0';
  ppn[0x3e] = '\0';
  ppn[0x3f] = '\0';
  ppn[0x20] = '\0';
  ppn[0x21] = '\0';
  ppn[0x22] = '\0';
  ppn[0x23] = '\0';
  ppn[0x24] = '\0';
  ppn[0x25] = '\0';
  ppn[0x26] = '\0';
  ppn[0x27] = '\0';
  ppn[0x28] = '\0';
  ppn[0x29] = '\0';
  ppn[0x2a] = '\0';
  ppn[0x2b] = '\0';
  ppn[0x2c] = '\0';
  ppn[0x2d] = '\0';
  ppn[0x2e] = '\0';
  ppn[0x2f] = '\0';
  ppn[0x10] = '\0';
  ppn[0x11] = '\0';
  ppn[0x12] = '\0';
  ppn[0x13] = '\0';
  ppn[0x14] = '\0';
  ppn[0x15] = '\0';
  ppn[0x16] = '\0';
  ppn[0x17] = '\0';
  ppn[0x18] = '\0';
  ppn[0x19] = '\0';
  ppn[0x1a] = '\0';
  ppn[0x1b] = '\0';
  ppn[0x1c] = '\0';
  ppn[0x1d] = '\0';
  ppn[0x1e] = '\0';
  ppn[0x1f] = '\0';
  ppn[0] = '\0';
  ppn[1] = '\0';
  ppn[2] = '\0';
  ppn[3] = '\0';
  ppn[4] = '\0';
  ppn[5] = '\0';
  ppn[6] = '\0';
  ppn[7] = '\0';
  ppn[8] = '\0';
  ppn[9] = '\0';
  ppn[10] = '\0';
  ppn[0xb] = '\0';
  ppn[0xc] = '\0';
  ppn[0xd] = '\0';
  ppn[0xe] = '\0';
  ppn[0xf] = '\0';
  ppn[0x60] = '\0';
  ppn[0x61] = '\0';
  ppn[0x62] = '\0';
  ppn[99] = '\0';
  __locale = setlocale(1,"C");
  local_230 = this;
  if (uVar7 < 5) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BVRFile.cpp"
               ,&local_25d);
    std::operator+(&local_f8,&local_118,":");
    std::__cxx11::to_string(&local_138,0x1f);
    std::operator+(local_d8,&local_f8,&local_138);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,local_d8,
                   ": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arena,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                   "BVRFile::BVRFile(std::vector<char> &)");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lines,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arena,
                   ": Assertion `");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pin,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lines,
                   "buffer_size > 4");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&point,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pin,
                   "\' failed.");
    std::__cxx11::string::operator=((string *)&(this->super_BRDFileBase).error_msg,(string *)&point)
    ;
    std::__cxx11::string::~string((string *)&point);
    std::__cxx11::string::~string((string *)&pin);
    std::__cxx11::string::~string((string *)&lines);
    std::__cxx11::string::~string((string *)&arena);
    std::__cxx11::string::~string((string *)&p);
    std::__cxx11::string::~string((string *)local_d8);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    SDL_LogError(1,"%s",(this->super_BRDFileBase).error_msg._M_dataplus._M_p);
  }
  else {
    __size = (uVar7 + 1) * 3;
    pcVar6 = (char *)calloc(1,__size);
    (this->super_BRDFileBase).file_buf = pcVar6;
    if (pcVar6 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BVRFile.cpp"
                 ,&local_25d);
      std::operator+(&local_f8,&local_118,":");
      std::__cxx11::to_string(&local_138,0x22);
      std::operator+(local_d8,&local_f8,&local_138);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                     local_d8,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arena,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                     "BVRFile::BVRFile(std::vector<char> &)");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lines,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arena,
                     ": Assertion `");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pin,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lines,
                     "file_buf != nullptr");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&point,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pin,
                     "\' failed.");
      std::__cxx11::string::operator=
                ((string *)&(this->super_BRDFileBase).error_msg,(string *)&point);
      std::__cxx11::string::~string((string *)&point);
      std::__cxx11::string::~string((string *)&pin);
      std::__cxx11::string::~string((string *)&lines);
      std::__cxx11::string::~string((string *)&arena);
      std::__cxx11::string::~string((string *)&p);
      std::__cxx11::string::~string((string *)local_d8);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      SDL_LogError(1,"%s",(this->super_BRDFileBase).error_msg._M_dataplus._M_p);
    }
    else {
      __src = (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_start;
      __n = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)__src;
      if (__n != 0) {
        memmove(pcVar6,__src,__n);
      }
      pcVar6[uVar7] = '\0';
      arena = pcVar6 + uVar7 + 1;
      pcVar6[__size - 1] = '\0';
      lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      stringfile(pcVar6,&lines);
      local_258 = pcVar6 + (__size - 1);
      local_25c = 0;
      ppcVar4 = lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      while (ppcVar8 = ppcVar4, pBVar3 = local_230,
            ppcVar8 < lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
        pcVar6 = *ppcVar8 + -1;
        do {
          bVar1 = pcVar6[1];
          pcVar6 = pcVar6 + 1;
          iVar5 = isspace((uint)bVar1);
        } while (iVar5 != 0);
        ppcVar4 = ppcVar8 + 1;
        if (bVar1 != 0) {
          iVar5 = strcmp(pcVar6,"<<Layout>>");
          if (iVar5 == 0) {
            local_25c = 1;
          }
          else {
            iVar5 = strcmp(pcVar6,"<<Pin>>");
            if (iVar5 == 0) {
              local_25c = 2;
            }
            else {
              iVar5 = strcmp(pcVar6,"<<Nail>>");
              if (iVar5 != 0) {
                p = pcVar6;
                (*(code *)(&DAT_001b9e08 + *(int *)(&DAT_001b9e08 + (ulong)local_25c * 4)))();
                return;
              }
              local_25c = 3;
            }
          }
          ppcVar4 = ppcVar8 + 2;
        }
      }
      pBVar2 = (local_230->super_BRDFileBase).format.
               super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
               super__Vector_impl_data._M_finish;
      (local_230->super_BRDFileBase).num_parts =
           (uint)(((long)(local_230->super_BRDFileBase).parts.
                         super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(local_230->super_BRDFileBase).parts.
                        super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x48);
      (local_230->super_BRDFileBase).num_pins =
           (uint)(((long)(local_230->super_BRDFileBase).pins.
                         super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(local_230->super_BRDFileBase).pins.
                        super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x38);
      (local_230->super_BRDFileBase).num_format =
           (uint)((ulong)((long)pBVar2 -
                         (long)(local_230->super_BRDFileBase).format.
                               super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3);
      (local_230->super_BRDFileBase).num_nails =
           (uint)(((long)(local_230->super_BRDFileBase).nails.
                         super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(local_230->super_BRDFileBase).nails.
                        super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x18);
      setlocale(1,__locale);
      (pBVar3->super_BRDFileBase).valid = local_25c != 0;
      std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base
                (&lines.super__Vector_base<char_*,_std::allocator<char_*>_>);
    }
  }
  return;
}

Assistant:

BVRFile::BVRFile(std::vector<char> &buf) {
	auto buffer_size = buf.size();

	char *saved_locale;
	char ppn[100] = {0};                        // previous part name
	saved_locale  = setlocale(LC_NUMERIC, "C"); // Use '.' as delimiter for strtod

	ENSURE_OR_FAIL(buffer_size > 4, error_msg, return);
	size_t file_buf_size = 3 * (1 + buffer_size);
	file_buf             = (char *)calloc(1, file_buf_size);
	ENSURE_OR_FAIL(file_buf != nullptr, error_msg, return);

	std::copy(buf.begin(), buf.end(), file_buf);
	file_buf[buffer_size] = 0;
	// This is for fixing degenerate utf8
	char *arena     = &file_buf[buffer_size + 1];
	char *arena_end = file_buf + file_buf_size - 1;
	*arena_end      = 0;

	int current_block = 0;

	std::vector<char *> lines;
	stringfile(file_buf, lines);

	std::vector<char *>::iterator line_it = lines.begin();
	while (line_it < lines.end()) {
		char *line = *line_it;
		++line_it;

		while (isspace((uint8_t)*line)) line++;
		if (!line[0]) continue;

		if (!strcmp(line, "<<Layout>>")) {
			//			fprintf(stderr,"HIT LAYOUT\n");
			current_block = 1;
			line_it += 1; // Skip 1 unused lines before 1st layout
			continue;
		}
		if (!strcmp(line, "<<Pin>>")) {
			current_block = 2;
			//			fprintf(stderr,"HIT PIN, block = %d\n", current_block);
			line_it += 1; // Skip 1 unused lines before 1st pin
			continue;
		}
		if (!strcmp(line, "<<Nail>>")) {
			//			fprintf(stderr,"HIT NAIL\n");
			current_block = 3;
			line_it += 1; // Skip 1 unused lines before 1st nail
			continue;
		}

		char *p = line;
		char *s;

		switch (current_block) {
			case 1: { // Format
				BRDPoint point;
				double x = READ_DOUBLE();
				point.x  = trunc(x * 1000); // OBV uses integers
				if (*p == ',') p++;
				double y = READ_DOUBLE();
				point.y  = trunc(y * 1000);
				format.push_back(point);
			} break;

			case 2: { // Parts & Pins
				BRDPart part;
				BRDPin pin;

				part.name      = READ_STR();
				part.part_type = BRDPartType::SMD;
				char *loc      = READ_STR();
				if (!strcmp(loc, "(T)"))
					part.mounting_side = BRDPartMountingSide::Top; // SMD part on top
				else
					part.mounting_side = BRDPartMountingSide::Bottom; // SMD part on bottom

				// If this is the first time we've seen this part
				if ((strcmp(ppn, part.name))) {
					part.end_of_pins = 0;
					parts.push_back(part);
					snprintf(ppn, sizeof(ppn), "%s", part.name);
				}

				pin.part = parts.size(); // the part this pin is associated with, is the last part on the vector

				/*int id =*/READ_INT(); // uint
				pin.name = READ_STR();
				double posx = READ_DOUBLE();
				pin.pos.x   = trunc(posx * 1000);
				double posy = READ_DOUBLE();
				pin.pos.y   = trunc(posy * 1000);
				/*int layer =*/READ_INT(); // uint
				pin.net = READ_STR();
				// pin.probe = READ_INT();
				switch (part.mounting_side) {
					case BRDPartMountingSide::Top:    pin.side = BRDPinSide::Top;    break;
					case BRDPartMountingSide::Bottom: pin.side = BRDPinSide::Bottom; break;
					case BRDPartMountingSide::Both:   pin.side = BRDPinSide::Both;   break;
				}
				//
				pins.push_back(pin);
				parts.back().end_of_pins = pins.size();
			} break;

			case 3: { // Nails
				BRDNail nail;

				p           = nextfield(p);
				double posx = READ_DOUBLE();
				nail.pos.x  = trunc(posx * 1000);
				double posy = READ_DOUBLE();
				nail.pos.y  = trunc(posy * 1000);
				/*int type =*/READ_INT(); // uint
				/*char *grid =*/READ_STR();
				char *loc = READ_STR();
				if (!strcmp(loc, "(T)"))
					nail.side = BRDPartMountingSide::Top;
				else
					nail.side = BRDPartMountingSide::Bottom;

				/*char *netid =*/READ_STR();
				nail.net   = READ_STR();
				nail.pos.x = posx * 1000;
				nail.pos.y = posy * 1000;
				nails.push_back(nail);
				// nail.probe = READ_INT();
				//
			} break;

			default: continue;
		}
	}

	num_parts  = parts.size();
	num_pins   = pins.size();
	num_format = format.size();
	num_nails  = nails.size();

	setlocale(LC_NUMERIC, saved_locale); // Restore locale

	valid = current_block != 0;
}